

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O0

int forkfd_wait4(int ffd,forkfd_info *info,int options,rusage *rusage)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  rusage *in_RCX;
  int in_EDX;
  forkfd_info *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int ret;
  pipe_payload payload;
  int local_a4;
  forkfd_info local_a0;
  undefined1 auStack_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_a0,0xaa,0x98);
  iVar1 = system_has_forkfd();
  if (iVar1 != 0) {
    local_a4 = system_forkfd_wait(in_EDI,in_RSI,in_EDX,in_RCX);
    iVar1 = disable_fork_fallback();
    if (((iVar1 != 0) || (local_a4 != -1)) || (piVar2 = __errno_location(), *piVar2 != 9))
    goto LAB_007d99bb;
  }
  sVar3 = read(in_EDI,&local_a0,0x98);
  if ((int)sVar3 == -1) {
    local_a4 = -1;
  }
  else {
    if (in_RSI != (forkfd_info *)0x0) {
      *in_RSI = local_a0;
    }
    if (in_RCX != (rusage *)0x0) {
      memcpy(in_RCX,auStack_98,0x90);
    }
    local_a4 = 0;
  }
LAB_007d99bb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a4;
}

Assistant:

int forkfd_wait4(int ffd, struct forkfd_info *info, int options, struct rusage *rusage)
{
    struct pipe_payload payload;
    int ret;

    if (system_has_forkfd()) {
        /* if this is one of our pipes, not a procdesc/pidfd, we'll get an EBADF */
        ret = system_forkfd_wait(ffd, info, options, rusage);
        if (disable_fork_fallback() || ret != -1 || errno != EBADF)
            return ret;
    }

    ret = read(ffd, &payload, sizeof(payload));
    if (ret == -1)
        return ret;     /* pass errno, probably EINTR, EBADF or EWOULDBLOCK */

    assert(ret == sizeof(payload));
    if (info)
        *info = payload.info;
    if (rusage)
        *rusage = payload.rusage;

    return 0;           /* success */
}